

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> __thiscall
wabt::MakeUnique<wabt::GlobalImport,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string_view name;
  GlobalImport *this_00;
  
  this_00 = (GlobalImport *)operator_new(0x90);
  name.data_ = (args->_M_dataplus)._M_p;
  name.size_ = args->_M_string_length;
  GlobalImport::GlobalImport(this_00,name);
  *(GlobalImport **)this = this_00;
  return (__uniq_ptr_data<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>,_true,_true>)
         (__uniq_ptr_data<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}